

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O1

void __thiscall HashUtil_Ripemd160_Test::TestBody(HashUtil_Ripemd160_Test *this)

{
  pointer *ppuVar1;
  pointer puVar2;
  bool bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  ByteData160 byte_data;
  Pubkey local_a8;
  string local_88;
  Script local_68;
  ByteData160 local_30;
  
  cfd::core::ByteData160::ByteData160(&local_30);
  ppuVar1 = (pointer *)
            ((long)&local_68.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_68._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"0123456789abcdef","");
  cfd::core::ByteData::ByteData(&local_a8.data_,(string *)&local_68);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_88,&local_a8.data_);
  puVar2 = local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_88._M_dataplus._M_p;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88._M_string_length;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_88.field_2._M_allocated_capacity;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if ((pointer)local_88._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_68,&local_30);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_88,"byte_data.GetHex().c_str()",
             "\"cea1b21f1a739fba68d1d4290437d2c5609be1d3\"",(char *)local_68._vptr_Script,
             "cea1b21f1a739fba68d1d4290437d2c5609be1d3");
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((pointer)local_88._M_string_length == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_68._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_68._vptr_Script + 8))();
      }
      local_68._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"0123456789abcdef0123456789abcdef01234567","");
  cfd::core::ByteData160::ByteData160((ByteData160 *)&local_a8,(string *)&local_68);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_88,(ByteData160 *)&local_a8);
  puVar2 = local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_88._M_dataplus._M_p;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88._M_string_length;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_88.field_2._M_allocated_capacity;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if ((pointer)local_88._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_68,&local_30);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_88,"byte_data.GetHex().c_str()",
             "\"49ec9207a365f6f330d529ca2a79e23a7ea2b526\"",(char *)local_68._vptr_Script,
             "49ec9207a365f6f330d529ca2a79e23a7ea2b526");
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((pointer)local_88._M_string_length == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x2a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_68._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_68._vptr_Script + 8))();
      }
      local_68._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"1234567890123456789012345678901234567890123456789012345678901234",
             "");
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_a8,(string *)&local_68);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_88,(ByteData256 *)&local_a8);
  puVar2 = local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_88._M_dataplus._M_p;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88._M_string_length;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_88.field_2._M_allocated_capacity;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if ((pointer)local_88._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_68,&local_30);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_88,"byte_data.GetHex().c_str()",
             "\"a5b1c86f10c81c3c543304e9891815d8de036296\"",(char *)local_68._vptr_Script,
             "a5b1c86f10c81c3c543304e9891815d8de036296");
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((pointer)local_88._M_string_length == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x2d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_68._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_68._vptr_Script + 8))();
      }
      local_68._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db","");
  cfd::core::Pubkey::Pubkey(&local_a8,(string *)&local_68);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_88,&local_a8);
  puVar2 = local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_88._M_dataplus._M_p;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88._M_string_length;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_88.field_2._M_allocated_capacity;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if (local_88._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_68,&local_30);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_88,"byte_data.GetHex().c_str()",
             "\"1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca\"",(char *)local_68._vptr_Script,
             "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x30,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_68._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_68._vptr_Script + 8))();
      }
      local_68._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,
             "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"
             ,"");
  cfd::core::Script::Script(&local_68,&local_88);
  cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_a8,&local_68);
  puVar2 = local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Script::~Script(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&local_68,&local_30);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_88,"byte_data.GetHex().c_str()",
             "\"6be854f95bade5490a020c3841c50d08339a5c89\"",(char *)local_68._vptr_Script,
             "6be854f95bade5490a020c3841c50d08339a5c89");
  if (local_68._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_68._vptr_Script);
  }
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x33,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_68._vptr_Script != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_68._vptr_Script != (_func_int **)0x0)) {
        (**(code **)(*local_68._vptr_Script + 8))();
      }
      local_68._vptr_Script = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HashUtil, Ripemd160) {
  ByteData160 byte_data;
  byte_data = HashUtil::Ripemd160(ByteData("0123456789abcdef"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "cea1b21f1a739fba68d1d4290437d2c5609be1d3");

  byte_data = HashUtil::Ripemd160(ByteData160("0123456789abcdef0123456789abcdef01234567"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "49ec9207a365f6f330d529ca2a79e23a7ea2b526");

  byte_data = HashUtil::Ripemd160(ByteData256("1234567890123456789012345678901234567890123456789012345678901234"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "a5b1c86f10c81c3c543304e9891815d8de036296");

  byte_data = HashUtil::Ripemd160(Pubkey("032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "1c8eae98d10ae2eb0ce0a99d446f0156c6f596ca");

  byte_data = HashUtil::Ripemd160(Script("21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"));
  EXPECT_STREQ(byte_data.GetHex().c_str(), "6be854f95bade5490a020c3841c50d08339a5c89");
}